

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_listener_base.cpp
# Opt level: O2

void __thiscall zmq::stream_listener_base_t::~stream_listener_base_t(stream_listener_base_t *this)

{
  (this->super_own_t).super_object_t._vptr_object_t =
       (_func_int **)&PTR__stream_listener_base_t_00248338;
  (this->super_io_object_t).super_i_poll_events._vptr_i_poll_events = (_func_int **)&DAT_00248420;
  if (this->_s != -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s == retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x39);
    fflush(_stderr);
    zmq_abort("_s == retired_fd");
  }
  if (this->_handle != (handle_t)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_handle",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x3a);
    fflush(_stderr);
    zmq_abort("!_handle");
  }
  std::__cxx11::string::~string((string *)&this->_endpoint);
  io_object_t::~io_object_t(&this->super_io_object_t);
  own_t::~own_t(&this->super_own_t);
  return;
}

Assistant:

zmq::stream_listener_base_t::~stream_listener_base_t ()
{
    zmq_assert (_s == retired_fd);
    zmq_assert (!_handle);
}